

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchC::is_valid_val(MthdKelvinFdBeginPatchC *this)

{
  MthdKelvinFdBeginPatchC *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3b < 4) {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3b < 0x12) {
      if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x26) >> 0x3b <
          ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3b) {
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x3b <
            ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3b) {
          if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) < 0) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (chipset.card_type != 0x20)
			return true;
		if (extr(val, 16, 5) < 4)
			return false;
		if (extr(val, 16, 5) > 0x11)
			return false;
		if (extr(val, 21, 5) >= extr(val, 16, 5))
			return false;
		if (extr(val, 26, 5) >= extr(val, 16, 5))
			return false;
		if (extr(val, 31, 1))
			return false;
		return true;
	}